

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx1231_ods.c
# Opt level: O3

int rf_set_pa(rf_dev_t *dev,uint8_t level,_Bool pa1_on)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  undefined7 in_register_00000011;
  
  bVar1 = level - 4;
  if ((int)CONCAT71(in_register_00000011,pa1_on) == 0) {
    bVar1 = level;
  }
  if (level < 0x20) {
    bVar1 = level;
  }
  if (0x1f < bVar1) {
    return 2;
  }
  bVar3 = 0x80;
  if (pa1_on) {
    bVar3 = (0x1f < level) << 5 | 0x40;
  }
  iVar2 = spi_write_reg(dev->fd,'\x11',bVar3 | bVar1);
  return iVar2;
}

Assistant:

int rf_set_pa(rf_dev_t *dev, uint8_t level, bool pa1_on)
{
	uint8_t val = 0;
	if (pa1_on) {
		val |= 0x40;
		if (level > 0x1f) {
			val |= 0x20;
			level -= 4;
		}
	} else {
		val |= 0x80;
	}

	if (level > 0x1f) {
		return ERR_INVAL;
	}

	val |= level;

	return spi_write_reg(dev->fd, RegPaLevel, val);
}